

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GenerateIntegerConstant
          (ConstantManager *this,Integer *integer_type,uint64_t result)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  pointer value;
  bool bVar1;
  uint32_t uVar2;
  Constant *pCVar3;
  uint local_64;
  iterator local_60;
  undefined8 local_58;
  uint local_50;
  undefined4 local_4c;
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint64_t result_local;
  Integer *integer_type_local;
  ConstantManager *this_local;
  
  words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)result;
  if (integer_type == (Integer *)0x0) {
    __assert_fail("integer_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x212,
                  "const Constant *spvtools::opt::analysis::ConstantManager::GenerateIntegerConstant(const analysis::Integer *, uint64_t)"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  uVar2 = Integer::width(integer_type);
  if (uVar2 == 0x40) {
    local_50 = (uint)words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    local_4c = (undefined4)
               ((ulong)words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_48 = &local_50;
    local_40 = 2;
    __l_00._M_len = 2;
    __l_00._M_array = local_48;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,__l_00);
  }
  else {
    uVar2 = Integer::width(integer_type);
    if (0x20 < uVar2) {
      __assert_fail("integer_type->width() <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                    ,0x21b,
                    "const Constant *spvtools::opt::analysis::ConstantManager::GenerateIntegerConstant(const analysis::Integer *, uint64_t)"
                   );
    }
    bVar1 = Integer::IsSigned(integer_type);
    value = words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    if (bVar1) {
      uVar2 = Integer::width(integer_type);
      words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)utils::SignExtendValue<unsigned_long>((unsigned_long)value,uVar2);
    }
    else {
      uVar2 = Integer::width(integer_type);
      words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)utils::ZeroExtendValue<unsigned_long>((unsigned_long)value,uVar2);
    }
    local_64 = (uint)words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    local_60 = &local_64;
    local_58 = 1;
    __l._M_len = 1;
    __l._M_array = local_60;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,__l);
  }
  pCVar3 = GetConstant(this,&integer_type->super_Type,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return pCVar3;
}

Assistant:

const Constant* ConstantManager::GenerateIntegerConstant(
    const analysis::Integer* integer_type, uint64_t result) {
  assert(integer_type != nullptr);

  std::vector<uint32_t> words;
  if (integer_type->width() == 64) {
    // In the 64-bit case, two words are needed to represent the value.
    words = {static_cast<uint32_t>(result),
             static_cast<uint32_t>(result >> 32)};
  } else {
    // In all other cases, only a single word is needed.
    assert(integer_type->width() <= 32);
    if (integer_type->IsSigned()) {
      result = utils::SignExtendValue(result, integer_type->width());
    } else {
      result = utils::ZeroExtendValue(result, integer_type->width());
    }
    words = {static_cast<uint32_t>(result)};
  }
  return GetConstant(integer_type, words);
}